

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double r8vec_dot(int n,double *a1,double *a2)

{
  ulong uVar1;
  double dVar2;
  
  if (n < 1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 0.0;
    uVar1 = 0;
    do {
      dVar2 = dVar2 + a1[uVar1] * a2[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  return dVar2;
}

Assistant:

double r8vec_dot ( int n, double a1[], double a2[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_DOT computes the dot product of a pair of R8VEC's.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 July 2005
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, double A1[N], A2[N], the two vectors to be considered.
//
//    Output, double R8VEC_DOT, the dot product of the vectors.
//
{
  int i;
  double value;

  value = 0.0;
  for ( i = 0; i < n; i++ )
  {
    value = value + a1[i] * a2[i];
  }

  return value;
}